

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::CheckHeaderInfo(Segment *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  Track *pTVar4;
  Track *track_1;
  Track *track;
  uint32_t i;
  Segment *this_local;
  
  if ((this->header_written_ & 1U) == 0) {
    bVar1 = WriteSegmentHeader(this);
    if (!bVar1) {
      return false;
    }
    uVar3 = MaxOffset(this);
    bVar1 = SeekHead::AddSeekEntry(&this->seek_head_,0x1f43b675,uVar3);
    if (!bVar1) {
      return false;
    }
    if (((this->output_cues_ & 1U) != 0) && (this->cues_track_ == 0)) {
      for (track._4_4_ = 0; uVar2 = Tracks::track_entries_size(&this->tracks_), track._4_4_ < uVar2;
          track._4_4_ = track._4_4_ + 1) {
        pTVar4 = Tracks::GetTrackByIndex(&this->tracks_,track._4_4_);
        if (pTVar4 == (Track *)0x0) {
          return false;
        }
        uVar3 = Track::number(pTVar4);
        bVar1 = Tracks::TrackIsVideo(&this->tracks_,uVar3);
        if (bVar1) {
          uVar3 = Track::number(pTVar4);
          this->cues_track_ = uVar3;
          break;
        }
      }
      if (this->cues_track_ == 0) {
        pTVar4 = Tracks::GetTrackByIndex(&this->tracks_,0);
        if (pTVar4 == (Track *)0x0) {
          return false;
        }
        uVar3 = Track::number(pTVar4);
        this->cues_track_ = uVar3;
      }
    }
  }
  return true;
}

Assistant:

bool Segment::CheckHeaderInfo() {
  if (!header_written_) {
    if (!WriteSegmentHeader())
      return false;

    if (!seek_head_.AddSeekEntry(libwebm::kMkvCluster, MaxOffset()))
      return false;

    if (output_cues_ && cues_track_ == 0) {
      // Check for a video track
      for (uint32_t i = 0; i < tracks_.track_entries_size(); ++i) {
        const Track* const track = tracks_.GetTrackByIndex(i);
        if (!track)
          return false;

        if (tracks_.TrackIsVideo(track->number())) {
          cues_track_ = track->number();
          break;
        }
      }

      // Set first track found
      if (cues_track_ == 0) {
        const Track* const track = tracks_.GetTrackByIndex(0);
        if (!track)
          return false;

        cues_track_ = track->number();
      }
    }
  }
  return true;
}